

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O3

double calcErrAlgebraicRnPFocalRadialSingleLin
                 (Vector3d *vr,Vector3d *Cr,Vector3d *wr,Vector3d *tr,double f,double rd,double r0,
                 MatrixXd *X,MatrixXd *u,int direction)

{
  double *pdVar1;
  double dVar2;
  RhsNested pMVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double __x;
  undefined1 in_XMM8 [16];
  Vector3d uh;
  SrcEvaluatorType srcEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  Matrix3d I;
  double local_388;
  double dStack_380;
  undefined1 local_370 [40];
  double local_348;
  double dStack_340;
  undefined1 local_338 [16];
  Vector3d local_328;
  Vector3d local_308;
  Matrix<double,_3,_3,_0,_3,_3> local_2e8;
  product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_2a0;
  undefined1 local_228 [32];
  LhsNested local_208;
  RhsNested RStack_200;
  Matrix<double,_3,_3,_0,_3,_3> *local_1d0;
  double *local_1c8;
  variable_if_dynamic<long,__1> local_1c0;
  MatrixXd *local_1b0;
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  long local_198;
  Vector3d *local_190;
  scalar_constant_op<double> local_170;
  Vector3d *local_168;
  Matrix<double,_3,_3,_0,_3,_3> local_150;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  Matrix<double,_3,_3,_0,_3,_3> local_c0;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  if ((X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols < 1) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      local_2a0.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)&local_2e8;
      pMVar3 = (RhsNested)
               (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)((u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data + (long)pMVar3 * lVar5);
      local_228._0_8_ = local_370;
      local_2a0.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = (double)local_228;
      local_228._16_8_ = 1;
      local_208 = (LhsNested)0x0;
      RStack_200._0_8_ = 0;
      RStack_200.m_lhs._0_8_ = 3;
      local_2a0.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)&local_108;
      local_2a0.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)&local_150;
      local_228._8_8_ = pMVar3;
      local_228._24_8_ = local_228._0_8_;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = (double)pMVar3;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)local_228._0_8_;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&local_2a0);
      pdVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data + (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * lVar5;
      *(double *)(local_370 + (long)pMVar3 * 8) =
           (*pdVar1 * *pdVar1 + pdVar1[1] * pdVar1[1]) * rd + 1.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 1.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 1.0;
      dVar2 = pdVar1[direction];
      auVar17 = *(undefined1 (*) [16])
                 (vr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                 .array;
      dVar18 = (vr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[2];
      auVar8._0_8_ = dVar18 * dVar18 + auVar17._8_8_ * auVar17._8_8_ + auVar17._0_8_ * auVar17._0_8_
      ;
      auVar8._8_8_ = 0;
      in_XMM8 = sqrtpd(in_XMM8,auVar8);
      __x = in_XMM8._0_8_;
      dVar10 = 0.0;
      dVar13 = 0.0;
      dVar4 = 1.0;
      dVar15 = 1.0;
      dVar16 = 0.0;
      dVar7 = 1.0;
      dVar14 = 0.0;
      dVar11 = 0.0;
      dVar12 = 0.0;
      local_150.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 1.0 / f;
      if (1e-15 <= __x) {
        auVar9._8_8_ = __x;
        auVar9._0_8_ = __x;
        auVar17 = divpd(auVar17,auVar9);
        dVar18 = dVar18 / __x;
        local_370._24_16_ = in_XMM8;
        dStack_340 = sin(__x);
        local_338._8_8_ = 0;
        local_338._0_8_ = dVar18 * dStack_340;
        local_388 = auVar17._0_8_;
        dStack_380 = auVar17._8_8_;
        local_348 = dStack_340 * local_388;
        dStack_340 = dStack_340 * dStack_380;
        dVar15 = cos((double)local_370._24_8_);
        dVar13 = 1.0 - dVar15;
        in_XMM8._8_8_ = 0;
        in_XMM8._0_8_ = dVar18;
        dVar14 = dVar13 * local_388;
        dVar10 = dStack_340 + dVar18 * dVar14;
        dVar11 = dVar18 * dVar14 - dStack_340;
        dVar12 = dVar14 * dStack_380 - (double)local_338._0_8_;
        dVar4 = dVar18 * dVar13 * dVar18 + dVar15;
        dVar7 = dVar15 + dVar14 * local_388;
        dVar14 = (double)local_338._0_8_ + dVar14 * dStack_380;
        dVar18 = dVar13 * dStack_380 * dVar18;
        dVar15 = dVar15 + dVar13 * dStack_380 * dStack_380;
        dVar16 = local_348 + dVar18;
        dVar13 = dVar18 - local_348;
      }
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_370._0_8_;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_370._8_8_;
      local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (double)local_370._16_8_;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar7;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dVar14;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar11;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = dVar12;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = dVar15;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = dVar16;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = dVar10;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = dVar13;
      local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = dVar4;
      X_(&local_308);
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
      local_328.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2];
      X_(&local_328);
      local_1c0.m_value =
           (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_1c8 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_data + local_1c0.m_value * lVar5;
      local_1d0 = &local_2e8;
      local_1a8.m_value = 0;
      local_228._0_8_ = &local_78;
      local_228._8_8_ = &local_150;
      local_208 = &local_108;
      RStack_200.m_lhs.m_functor.m_other = dVar2 - r0;
      RStack_200.m_rhs = &local_c0;
      local_1b0 = X;
      local_1a0.m_value = lVar5;
      local_198 = local_1c0.m_value;
      local_190 = Cr;
      local_170.m_other = dVar2 - r0;
      local_168 = tr;
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator(&local_2a0,(XprType *)local_228);
      dVar6 = dVar6 + ABS(local_2a0.m_lhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[5] *
                          local_2a0.m_rhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1] +
                          local_2a0.m_lhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[8] *
                          local_2a0.m_rhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] +
                          local_2a0.m_lhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[2] *
                          local_2a0.m_rhs.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]) +
                      ABS(*(double *)
                           ((long)local_2a0.m_rhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  .m_d.data + 0x10) *
                          *(double *)
                           ((long)local_2a0.m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  .m_d.data + 0x38) +
                          *(double *)
                           ((long)local_2a0.m_rhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  .m_d.data + 8) *
                          *(double *)
                           ((long)local_2a0.m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  .m_d.data + 0x20) +
                          *(double *)
                           ((long)local_2a0.m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  .m_d.data + 8) *
                          *(double *)
                           local_2a0.m_rhsImpl.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           .m_d.data) +
                      ABS(*(double *)
                           ((long)local_2a0.m_rhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  .m_d.data + 0x10) *
                          *(double *)
                           ((long)local_2a0.m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  .m_d.data + 0x30) +
                          *(double *)
                           ((long)local_2a0.m_rhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  .m_d.data + 8) *
                          *(double *)
                           ((long)local_2a0.m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  .m_d.data + 0x18) +
                          *(double *)
                           local_2a0.m_lhsImpl.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                           .m_d.data *
                          *(double *)
                           local_2a0.m_rhsImpl.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           .m_d.data);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols);
  }
  return dVar6;
}

Assistant:

double calcErrAlgebraicRnPFocalRadialSingleLin(Eigen::Vector3d vr, Eigen::Vector3d Cr, Eigen::Vector3d wr, Eigen::Vector3d tr, double f, double rd, double r0, Eigen::MatrixXd X, Eigen::MatrixXd u, int direction){
    double err = 0;
    for (int i = 0; i < X.cols(); i++)
    {
        Eigen::Vector3d uh; 
        uh << u.col(i), 1 + rd*(u(0,i)*u(0,i) + u(1,i)*u(1,i));
        Eigen::Matrix3d K = Eigen::Matrix3d::Identity();
        K(2,2) = 1/f;
        Eigen::Matrix3d I = Eigen::Matrix3d::Identity();
        double rs = (u(direction,i)-r0);
        Eigen::Matrix3d Rv;
        double n = vr.norm();
        if(n < 1e-15){
            Rv = Eigen::AngleAxis<double>(0, (Eigen::Vector3d() << 1,0,0).finished()).toRotationMatrix();
        }else{
            Rv = Eigen::AngleAxis<double>(n, vr/n).toRotationMatrix();
        }
        
        Eigen::Vector3d eq = X_(uh)*K*((I + rs*X_(wr))*Rv*X.col(i) + Cr + rs*tr);
        err += eq.cwiseAbs().sum();
    }
    return err;
}